

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cCopyImageTests.cpp
# Opt level: O0

void __thiscall
gl4cts::CopyImage::IncompatibleFormatsTest::IncompatibleFormatsTest
          (IncompatibleFormatsTest *this,Context *context)

{
  bool bVar1;
  undefined1 local_ec [8];
  testCase test_case_4;
  GLenum tex_target_4;
  GLuint target_4;
  testCase test_case_3;
  GLenum tex_target_3;
  GLuint target_3;
  testCase test_case_2;
  GLenum tex_target_2;
  GLuint target_2;
  testCase test_case_1;
  GLenum tex_target_1;
  GLuint target_1;
  undefined1 local_40 [8];
  testCase test_case;
  GLenum tex_target;
  GLuint target;
  Context *context_local;
  IncompatibleFormatsTest *this_local;
  
  deqp::TestCase::TestCase
            (&this->super_TestCase,context,"incompatible_formats",
             "Test verifies if INVALID_OPERATION is generated when textures provided to CopySubImageData are incompatible"
            );
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__IncompatibleFormatsTest_0321e688;
  this->m_dst_buf_name = 0;
  this->m_dst_tex_name = 0;
  this->m_src_buf_name = 0;
  this->m_src_tex_name = 0;
  this->m_test_case_index = 0;
  std::
  vector<gl4cts::CopyImage::IncompatibleFormatsTest::testCase,_std::allocator<gl4cts::CopyImage::IncompatibleFormatsTest::testCase>_>
  ::vector(&this->m_test_cases);
  for (test_case.m_expected_result = 0; test_case.m_expected_result < 0xb;
      test_case.m_expected_result = test_case.m_expected_result + 1) {
    local_40._0_4_ = *(undefined4 *)(s_valid_targets + (ulong)test_case.m_expected_result * 4);
    local_40._4_4_ = 0x8d7c;
    test_case.m_tex_target = 0x8d99;
    test_case.m_dst_internal_format = 0x1401;
    test_case.m_dst_format = 0x8d76;
    test_case.m_dst_type = 0x8d99;
    test_case.m_src_internal_format = 0x1403;
    test_case.m_src_format = 0x502;
    test_case.m_src_type = local_40._0_4_;
    bVar1 = Utils::isTargetMultisampled(local_40._0_4_);
    if (!bVar1) {
      std::
      vector<gl4cts::CopyImage::IncompatibleFormatsTest::testCase,_std::allocator<gl4cts::CopyImage::IncompatibleFormatsTest::testCase>_>
      ::push_back(&this->m_test_cases,(value_type *)local_40);
    }
  }
  for (test_case_1.m_expected_result = 0; test_case_1.m_expected_result < 0xb;
      test_case_1.m_expected_result = test_case_1.m_expected_result + 1) {
    tex_target_2 = *(GLenum *)(s_valid_targets + (ulong)test_case_1.m_expected_result * 4);
    target_2 = 0x8d7c;
    test_case_1.m_tex_target = 0x8d99;
    test_case_1.m_dst_internal_format = 0x1401;
    test_case_1.m_dst_format = 0x8d70;
    test_case_1.m_dst_type = 0x8d99;
    test_case_1.m_src_internal_format = 0x1405;
    test_case_1.m_src_format = 0x502;
    test_case_1.m_src_type = tex_target_2;
    bVar1 = Utils::isTargetMultisampled(tex_target_2);
    if (!bVar1) {
      std::
      vector<gl4cts::CopyImage::IncompatibleFormatsTest::testCase,_std::allocator<gl4cts::CopyImage::IncompatibleFormatsTest::testCase>_>
      ::push_back(&this->m_test_cases,(value_type *)&tex_target_2);
    }
  }
  for (test_case_2.m_expected_result = 0; test_case_2.m_expected_result < 0xb;
      test_case_2.m_expected_result = test_case_2.m_expected_result + 1) {
    tex_target_3 = *(GLenum *)(s_valid_targets + (ulong)test_case_2.m_expected_result * 4);
    target_3 = 0x8d76;
    test_case_2.m_tex_target = 0x8d99;
    test_case_2.m_dst_internal_format = 0x1403;
    test_case_2.m_dst_format = 0x823a;
    test_case_2.m_dst_type = 0x8228;
    test_case_2.m_src_internal_format = 0x1403;
    test_case_2.m_src_format = 0x502;
    test_case_2.m_src_type = tex_target_3;
    bVar1 = Utils::isTargetMultisampled(tex_target_3);
    if (!bVar1) {
      std::
      vector<gl4cts::CopyImage::IncompatibleFormatsTest::testCase,_std::allocator<gl4cts::CopyImage::IncompatibleFormatsTest::testCase>_>
      ::push_back(&this->m_test_cases,(value_type *)&tex_target_3);
    }
  }
  for (test_case_3.m_expected_result = 0; test_case_3.m_expected_result < 0xb;
      test_case_3.m_expected_result = test_case_3.m_expected_result + 1) {
    tex_target_4 = *(GLenum *)(s_valid_targets + (ulong)test_case_3.m_expected_result * 4);
    target_4 = 0x8d70;
    test_case_3.m_tex_target = 0x8d99;
    test_case_3.m_dst_internal_format = 0x1405;
    test_case_3.m_dst_format = 0x8814;
    test_case_3.m_dst_type = 0x1908;
    test_case_3.m_src_internal_format = 0x1406;
    test_case_3.m_src_format = 0;
    test_case_3.m_src_type = tex_target_4;
    bVar1 = Utils::isTargetMultisampled(tex_target_4);
    if (!bVar1) {
      std::
      vector<gl4cts::CopyImage::IncompatibleFormatsTest::testCase,_std::allocator<gl4cts::CopyImage::IncompatibleFormatsTest::testCase>_>
      ::push_back(&this->m_test_cases,(value_type *)&tex_target_4);
    }
  }
  for (test_case_4.m_expected_result = 0; test_case_4.m_expected_result < 0xb;
      test_case_4.m_expected_result = test_case_4.m_expected_result + 1) {
    local_ec._0_4_ = *(undefined4 *)(s_valid_targets + (ulong)test_case_4.m_expected_result * 4);
    local_ec._4_4_ = 0x8058;
    test_case_4.m_tex_target = 0x1908;
    test_case_4.m_dst_internal_format = 0x1401;
    test_case_4.m_dst_format = 0x8814;
    test_case_4.m_dst_type = 0x1908;
    test_case_4.m_src_internal_format = 0x1406;
    test_case_4.m_src_format = 0x502;
    test_case_4.m_src_type = local_ec._0_4_;
    bVar1 = Utils::isTargetMultisampled(local_ec._0_4_);
    if (!bVar1) {
      std::
      vector<gl4cts::CopyImage::IncompatibleFormatsTest::testCase,_std::allocator<gl4cts::CopyImage::IncompatibleFormatsTest::testCase>_>
      ::push_back(&this->m_test_cases,(value_type *)local_ec);
    }
  }
  return;
}

Assistant:

IncompatibleFormatsTest::IncompatibleFormatsTest(deqp::Context& context)
	: TestCase(
		  context, "incompatible_formats",
		  "Test verifies if INVALID_OPERATION is generated when textures provided to CopySubImageData are incompatible")
	, m_dst_buf_name(0)
	, m_dst_tex_name(0)
	, m_src_buf_name(0)
	, m_src_tex_name(0)
	, m_test_case_index(0)
{
	/* RGBA8UI vs RGBA16UI */
	for (GLuint target = 0; target < s_n_valid_targets; ++target)
	{
		const GLenum tex_target = s_valid_targets[target];

		testCase test_case = { tex_target,  GL_RGBA8UI,		 GL_RGBA_INTEGER,   GL_UNSIGNED_BYTE,
							   GL_RGBA16UI, GL_RGBA_INTEGER, GL_UNSIGNED_SHORT, GL_INVALID_OPERATION };

		/* Skip multisampled and rectangle targets */
		if (true == Utils::isTargetMultisampled(tex_target))
		{
			continue;
		}

		m_test_cases.push_back(test_case);
	}

	/* RGBA8UI vs RGBA32UI */
	for (GLuint target = 0; target < s_n_valid_targets; ++target)
	{
		const GLenum tex_target = s_valid_targets[target];

		testCase test_case = { tex_target,  GL_RGBA8UI,		 GL_RGBA_INTEGER, GL_UNSIGNED_BYTE,
							   GL_RGBA32UI, GL_RGBA_INTEGER, GL_UNSIGNED_INT, GL_INVALID_OPERATION };

		/* Skip multisampled and rectangle targets */
		if (true == Utils::isTargetMultisampled(tex_target))
		{
			continue;
		}

		m_test_cases.push_back(test_case);
	}

	/* RGBA16UI vs RG16UI */
	for (GLuint target = 0; target < s_n_valid_targets; ++target)
	{
		const GLenum tex_target = s_valid_targets[target];

		testCase test_case = { tex_target, GL_RGBA16UI,   GL_RGBA_INTEGER,   GL_UNSIGNED_SHORT,
							   GL_RG16UI,  GL_RG_INTEGER, GL_UNSIGNED_SHORT, GL_INVALID_OPERATION };

		/* Skip multisampled and rectangle targets */
		if (true == Utils::isTargetMultisampled(tex_target))
		{
			continue;
		}

		m_test_cases.push_back(test_case);
	}

	/* RGBA32UI vs RGBA32F */
	for (GLuint target = 0; target < s_n_valid_targets; ++target)
	{
		const GLenum tex_target = s_valid_targets[target];

		testCase test_case = { tex_target, GL_RGBA32UI, GL_RGBA_INTEGER, GL_UNSIGNED_INT,
							   GL_RGBA32F, GL_RGBA,		GL_FLOAT,		 GL_NO_ERROR };

		/* Skip multisampled and rectangle targets */
		if (true == Utils::isTargetMultisampled(tex_target))
		{
			continue;
		}

		m_test_cases.push_back(test_case);
	}

	/* RGBA8 vs RGBA32F */
	for (GLuint target = 0; target < s_n_valid_targets; ++target)
	{
		const GLenum tex_target = s_valid_targets[target];

		testCase test_case = { tex_target, GL_RGBA8, GL_RGBA,  GL_UNSIGNED_BYTE,
							   GL_RGBA32F, GL_RGBA,  GL_FLOAT, GL_INVALID_OPERATION };

		/* Skip multisampled and rectangle targets */
		if (true == Utils::isTargetMultisampled(tex_target))
		{
			continue;
		}

		m_test_cases.push_back(test_case);
	}
}